

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
          LogicalType *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  string *value;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffef0;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [48];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ExceptionFormatValue local_68;
  
  pEVar1 = (values->
           super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pEVar1,
             &((values->
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               )._M_impl.super__Vector_impl_data._M_finish)->type + (long)pEVar1);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            (&local_68,(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.str_val._M_dataplus._M_p != &local_68.str_val.field_2) {
    operator_delete(local_68.str_val._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  LogicalType::LogicalType((LogicalType *)(local_d8 + 0x18),(LogicalType *)param);
  puVar3 = &stack0xfffffffffffffed8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffec8,*(long *)params,
             (long)&((params->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params);
  LogicalType::LogicalType((LogicalType *)local_d8,(LogicalType *)params_1);
  local_f8[0] = local_e8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,*(long *)params_2._0_8_,
             *(long *)(params_2._0_8_ + 8) + *(long *)params_2._0_8_);
  puVar4 = &stack0xfffffffffffffef8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,
             (params_2.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ExtraTypeInfo,
             *(long *)&(params_2.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->type +
             (long)(params_2.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo);
  uVar2 = 0x1242701;
  local_a8[0] = local_98;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,
             (params_2.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_vptr__Sp_counted_base,
             *(long *)&(params_2.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count +
             (long)(params_2.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base);
  params_2_00._M_string_length = (size_type)local_a8;
  params_2_00._M_dataplus._M_p = (pointer)&stack0xfffffffffffffee8;
  params_2_00.field_2._M_allocated_capacity = uVar2;
  params_2_00.field_2._8_8_ = in_stack_fffffffffffffeb8;
  params_3_00._M_string_length = (size_type)puVar3;
  params_3_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  params_3_00.field_2 = in_stack_fffffffffffffed0;
  params_4_00._M_string_length = (size_type)puVar4;
  params_4_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffee0;
  params_4_00.field_2 = in_stack_fffffffffffffef0;
  ConstructMessageRecursive<duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             (local_d8 + 0x18),(LogicalType *)&stack0xfffffffffffffec8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (LogicalType *)local_f8,params_2_00,params_3_00,params_4_00);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if (puVar4 != &stack0xfffffffffffffef8) {
    operator_delete(puVar4);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  LogicalType::~LogicalType((LogicalType *)local_d8);
  if (puVar3 != &stack0xfffffffffffffed8) {
    operator_delete(puVar3);
  }
  LogicalType::~LogicalType((LogicalType *)(local_d8 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}